

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_stg.c
# Opt level: O0

int idaNlsResidualSensStg(N_Vector ycorStg,N_Vector resStg,void *ida_mem)

{
  int iVar1;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int retval;
  IDAMem IDA_mem;
  int local_1c;
  
  if (in_RDX == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,300,"idaNlsResidualSensStg",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_stg.c"
                    ,"ida_mem = NULL illegal.");
    local_1c = -0x14;
  }
  else {
    N_VLinearSumVectorArray
              (0x3ff0000000000000,*(undefined4 *)(in_RDX + 0xa0),*(undefined8 *)(in_RDX + 0x3a0),
               *(undefined8 *)*in_RDI,*(undefined8 *)(in_RDX + 0x390));
    N_VLinearSumVectorArray
              (0x3ff0000000000000,*(undefined8 *)(in_RDX + 0x508),*(undefined4 *)(in_RDX + 0xa0),
               *(undefined8 *)(in_RDX + 0x3a8),*(undefined8 *)*in_RDI,
               *(undefined8 *)(in_RDX + 0x398));
    iVar1 = (**(code **)(in_RDX + 0xa8))
                      (*(undefined8 *)(in_RDX + 0x4f8),*(undefined4 *)(in_RDX + 0xa0),
                       *(undefined8 *)(in_RDX + 0x280),*(undefined8 *)(in_RDX + 0x288),
                       *(undefined8 *)(in_RDX + 0x2a0),*(undefined8 *)(in_RDX + 0x390),
                       *(undefined8 *)(in_RDX + 0x398),*(undefined8 *)*in_RSI,
                       *(undefined8 *)(in_RDX + 0xb0),*(undefined8 *)(in_RDX + 0x3b8),
                       *(undefined8 *)(in_RDX + 0x3c0),*(undefined8 *)(in_RDX + 0x3c8));
    *(long *)(in_RDX + 0x5d0) = *(long *)(in_RDX + 0x5d0) + 1;
    if (iVar1 < 0) {
      local_1c = -0x29;
    }
    else if (iVar1 < 1) {
      local_1c = 0;
    }
    else {
      local_1c = 0xb;
    }
  }
  return local_1c;
}

Assistant:

static int idaNlsResidualSensStg(N_Vector ycorStg, N_Vector resStg, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* update yS and ypS based on the current correction */
  N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_yySpredict, ONE,
                          NV_VECS_SW(ycorStg), IDA_mem->ida_yyS);
  N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_ypSpredict,
                          IDA_mem->ida_cj, NV_VECS_SW(ycorStg), IDA_mem->ida_ypS);

  /* evaluate sens residual */
  retval = IDA_mem->ida_resS(IDA_mem->ida_Ns, IDA_mem->ida_tn, IDA_mem->ida_yy,
                             IDA_mem->ida_yp, IDA_mem->ida_delta,
                             IDA_mem->ida_yyS, IDA_mem->ida_ypS,
                             NV_VECS_SW(resStg), IDA_mem->ida_user_dataS,
                             IDA_mem->ida_tmpS1, IDA_mem->ida_tmpS2,
                             IDA_mem->ida_tmpS3);

  /* increment the number of sens residual evaluations */
  IDA_mem->ida_nrSe++;

  if (retval < 0) { return (IDA_SRES_FAIL); }
  if (retval > 0) { return (IDA_SRES_RECVR); }

  return (IDA_SUCCESS);
}